

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFEFStreamObjectHelper::getParam(QPDFEFStreamObjectHelper *this,string *pkey)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar2;
  QPDFObjectHandle params;
  allocator<char> local_69;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38 [32];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pkey->_M_string_length);
  QPDFObjectHandle::getDict((QPDFObjectHandle *)(local_68 + 0x10));
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/Params",&local_69);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_68,(string *)(local_68 + 0x10));
  std::__cxx11::string::~string(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_68);
  if (bVar1) {
    QPDFObjectHandle::getKey((QPDFObjectHandle *)this,(string *)local_68);
  }
  else {
    QPDFObjectHandle::newNull();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFEFStreamObjectHelper::getParam(std::string const& pkey)
{
    auto params = oh().getDict().getKey("/Params");
    if (params.isDictionary()) {
        return params.getKey(pkey);
    }
    return QPDFObjectHandle::newNull();
}